

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_rwkv_wkv7(ggml_context *ctx,ggml_tensor *r,ggml_tensor *w,ggml_tensor *k,ggml_tensor *v,
              ggml_tensor *a,ggml_tensor *b,ggml_tensor *state)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  int64_t iVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *result;
  int64_t ne [4];
  int64_t n_seqs;
  int64_t n_tokens;
  int64_t H;
  int64_t S;
  int in_stack_ffffffffffffff78;
  ggml_type in_stack_ffffffffffffff7c;
  ggml_context *in_stack_ffffffffffffff80;
  
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x1533e2);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d3,"GGML_ASSERT(%s) failed","ggml_is_contiguous(r)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x153411);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d4,"GGML_ASSERT(%s) failed","ggml_is_contiguous(w)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x153440);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d5,"GGML_ASSERT(%s) failed","ggml_is_contiguous(k)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x15346f);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d6,"GGML_ASSERT(%s) failed","ggml_is_contiguous(v)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x15349e);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d7,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x1534d0);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d8,"GGML_ASSERT(%s) failed","ggml_is_contiguous(b)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x153502);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12d9,"GGML_ASSERT(%s) failed","ggml_is_contiguous(state)");
  }
  lVar1 = in_RCX->ne[0];
  lVar2 = in_RCX->ne[1];
  lVar3 = in_RCX->ne[2];
  lVar4 = *(long *)(ne[0] + 0x18);
  if (((in_RDX->ne[0] == lVar1) && (in_RDX->ne[1] == lVar2)) && (in_RDX->ne[2] == lVar3)) {
    if (((in_RCX->ne[0] != lVar1) || (in_RCX->ne[1] != lVar2)) || (in_RCX->ne[2] != lVar3)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x12e1,"GGML_ASSERT(%s) failed",
                 "k->ne[0] == S && k->ne[1] == H && k->ne[2] == n_tokens");
    }
    if (((in_R8->ne[0] == lVar1) && (in_R8->ne[1] == lVar2)) && (in_R8->ne[2] == lVar3)) {
      if (((in_R9->ne[0] != lVar1) || (in_R9->ne[1] != lVar2)) || (in_R9->ne[2] != lVar3)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x12e3,"GGML_ASSERT(%s) failed",
                   "a->ne[0] == S && a->ne[1] == H && a->ne[2] == n_tokens");
      }
      if (((result->ne[0] == lVar1) && (result->ne[1] == lVar2)) && (result->ne[2] == lVar3)) {
        iVar6 = ggml_nelements((ggml_tensor *)ne[0]);
        if (iVar6 != lVar1 * lVar1 * lVar2 * lVar4) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x12e5,"GGML_ASSERT(%s) failed","ggml_nelements(state) == S * S * H * n_seqs")
          ;
        }
        pgVar7 = ggml_new_tensor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff78,(int64_t *)0x15379d);
        pgVar7->op = GGML_OP_RWKV_WKV7;
        pgVar7->src[0] = in_RSI;
        pgVar7->src[1] = in_RDX;
        pgVar7->src[2] = in_RCX;
        pgVar7->src[3] = in_R8;
        pgVar7->src[4] = in_R9;
        pgVar7->src[5] = result;
        pgVar7->src[6] = (ggml_tensor *)ne[0];
        return pgVar7;
      }
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x12e4,"GGML_ASSERT(%s) failed",
                 "b->ne[0] == S && b->ne[1] == H && b->ne[2] == n_tokens");
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12e2,"GGML_ASSERT(%s) failed",
               "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x12e0,
             "GGML_ASSERT(%s) failed","w->ne[0] == S && w->ne[1] == H && w->ne[2] == n_tokens");
}

Assistant:

struct ggml_tensor * ggml_rwkv_wkv7(
        struct ggml_context * ctx,
        struct ggml_tensor  * r,
        struct ggml_tensor  * w,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * state) {
    GGML_ASSERT(ggml_is_contiguous(r));
    GGML_ASSERT(ggml_is_contiguous(w));
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(b));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(w->ne[0] == S && w->ne[1] == H && w->ne[2] == n_tokens);
        GGML_ASSERT(k->ne[0] == S && k->ne[1] == H && k->ne[2] == n_tokens);
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(a->ne[0] == S && a->ne[1] == H && a->ne[2] == n_tokens);
        GGML_ASSERT(b->ne[0] == S && b->ne[1] == H && b->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_RWKV_WKV7;
    result->src[0] = r;
    result->src[1] = w;
    result->src[2] = k;
    result->src[3] = v;
    result->src[4] = a;
    result->src[5] = b;
    result->src[6] = state;

    return result;
}